

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O2

void __thiscall CWire::ClearSegmentList(CWire *this)

{
  pointer ppCVar1;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *pvVar2;
  int iIndex;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  iVar5 = (int)(((long)(this->m_SegmentList).
                       super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_SegmentList).
                      super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (iIndex = 0; iIndex != iVar5; iIndex = iIndex + 1) {
    pvVar2 = GetSegmentList(this,iIndex);
    uVar3 = (ulong)((long)(pvVar2->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar2->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
                         _M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar4 = uVar3 & 0xffffffff;
    if ((int)uVar3 < 1) {
      uVar4 = 0;
    }
    for (uVar3 = 0;
        ppCVar1 = (pvVar2->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                  super__Vector_impl_data._M_start, uVar4 != uVar3; uVar3 = uVar3 + 1) {
      CSegment::Delete(ppCVar1[uVar3]);
    }
    if ((pvVar2->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
        super__Vector_impl_data._M_finish != ppCVar1) {
      (pvVar2->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = ppCVar1;
    }
  }
  std::
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
  ::clear(&this->m_SegmentList);
  this->m_pRoutedSegmentList = (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0;
  return;
}

Assistant:

void CWire::ClearSegmentList()
{
	int	iNumSegmentList	=	GetNumSegmentList();

	for (int i=0;i<iNumSegmentList;++i)
	{
		vector<CSegment*>*	pSegmentList	=	GetSegmentList(i);
		for (int j=0,s=pSegmentList->size();j<s;++j)
		{
			(*pSegmentList)[j]->Delete();//SAFE_DEL((*pSegmentList)[j]);
		}

		pSegmentList->clear();
	}

	m_SegmentList.clear();
	m_pRoutedSegmentList	=	NULL;
}